

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Parse(lemon *gp)

{
  byte *pbVar1;
  ushort *puVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  byte *filebuf;
  size_t sVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  ushort **ppuVar11;
  byte *pbVar12;
  rule *prVar13;
  symbol *psVar14;
  symbol **ppsVar15;
  symbol *psVar16;
  undefined8 *puVar17;
  long *plVar18;
  void *pvVar19;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  undefined8 *puVar23;
  byte bVar24;
  byte bVar25;
  char *pcVar26;
  int iVar27;
  byte *__s2;
  byte *pbVar28;
  byte *pbVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  size_t sVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  pstate ps;
  int local_3fb4;
  char local_3f78 [56];
  char *local_3f40;
  uint local_3f38;
  int local_3f34;
  byte *local_3f30;
  lemon *local_3f28;
  undefined4 local_3f20;
  symbol *local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  byte *local_3f00;
  uint local_3ef8;
  long alStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  byte *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  e_assoc local_48;
  int local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f40,0,0x3f10);
  local_3f40 = gp->filename;
  local_3f34 = 0;
  local_3f20 = 0;
  local_3f28 = gp;
  __stream = fopen(local_3f40,"rb");
  if (__stream == (FILE *)0x0) {
    Parse_cold_10();
  }
  else {
    fseek(__stream,0,2);
    uVar6 = ftell(__stream);
    rewind(__stream);
    filebuf = (byte *)malloc((long)((uVar6 << 0x20) + 0x100000000) >> 0x20);
    if (((int)uVar6 < 0x5f5e101) && (filebuf != (byte *)0x0)) {
      sVar33 = (long)(uVar6 << 0x20) >> 0x20;
      sVar7 = fread(filebuf,1,sVar33,__stream);
      if (sVar7 != sVar33) {
        ErrorMsg(local_3f40,0,"Can\'t read in all %d bytes of this file.",uVar6 & 0xffffffff);
        free(filebuf);
        gp->errorcnt = gp->errorcnt + 1;
        fclose(__stream);
        return;
      }
      fclose(__stream);
      iVar4 = strip_crlf((char *)filebuf,(int)uVar6);
      filebuf[iVar4] = 0;
      ppcVar3 = azDefine;
      iVar4 = nDefine;
      lVar8 = (long)nDefine;
      uVar6 = (ulong)(uint)nDefine;
      pbVar28 = filebuf + 6;
      uVar32 = 0;
      local_3fb4 = 0;
      uVar34 = 6;
      pbVar29 = filebuf;
      for (lVar35 = 0; (bVar24 = filebuf[lVar35], bVar24 == 10 || (bVar24 != 0));
          lVar35 = lVar35 + 1) {
        if ((bVar24 == 0x25) && ((pbVar12 = filebuf + lVar35, lVar35 == 0 || (pbVar12[-1] == 10))))
        {
          iVar5 = strncmp((char *)pbVar12,"%endif",6);
          if ((iVar5 == 0) &&
             (ppuVar11 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar11 + (ulong)pbVar12[6] * 2 + 1) & 0x20) != 0)) {
            pbVar12 = pbVar29;
            if (uVar32 == 0) {
LAB_001066af:
              uVar32 = 0;
            }
            else {
              uVar32 = uVar32 - 1;
              if (uVar32 == 0) {
                lVar9 = (long)local_3fb4;
                if (lVar9 < lVar35) {
                  do {
                    if (filebuf[lVar9] != 10) {
                      filebuf[lVar9] = 0x20;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar35 != lVar9);
                }
                goto LAB_001066af;
              }
            }
            for (; (*pbVar12 != 0 && (*pbVar12 != 10)); pbVar12 = pbVar12 + 1) {
              *pbVar12 = 0x20;
            }
          }
          else {
            iVar5 = strncmp((char *)pbVar12,"%ifdef",6);
            if (((iVar5 == 0) &&
                (ppuVar11 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar11 + (ulong)pbVar12[6] * 2 + 1) & 0x20) != 0)) ||
               ((iVar5 = strncmp((char *)pbVar12,"%ifndef",7), iVar5 == 0 &&
                (ppuVar11 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar11 + (ulong)pbVar12[7] * 2 + 1) & 0x20) != 0)))) {
              pbVar10 = pbVar29;
              if (uVar32 == 0) {
                ppuVar11 = __ctype_b_loc();
                uVar22 = uVar34;
                __s2 = pbVar28;
                do {
                  pbVar1 = __s2 + 1;
                  __s2 = __s2 + 1;
                  uVar22 = uVar22 + 1;
                } while ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                bVar24 = filebuf[uVar22 & 0xffffffff];
                if (bVar24 == 0) {
                  uVar36 = 0;
                }
                else {
                  uVar36 = 0;
                  do {
                    if ((*(byte *)((long)*ppuVar11 + (ulong)bVar24 * 2 + 1) & 0x20) != 0) break;
                    bVar24 = filebuf[uVar36 + (uVar22 & 0xffffffff) + 1];
                    uVar36 = uVar36 + 1;
                  } while (bVar24 != 0);
                }
                bVar37 = true;
                bVar38 = 0 < lVar8;
                if (0 < iVar4) {
                  bVar38 = true;
                  uVar22 = 1;
                  do {
                    pcVar26 = ppcVar3[uVar22 - 1];
                    iVar5 = strncmp(pcVar26,(char *)__s2,uVar36 & 0xffffffff);
                    if ((iVar5 == 0) && (sVar7 = strlen(pcVar26), (int)uVar36 == (int)sVar7)) {
                      bVar37 = false;
                      goto LAB_001067ac;
                    }
                    bVar38 = (long)uVar22 < lVar8;
                    bVar37 = uVar22 != uVar6;
                    uVar22 = uVar22 + 1;
                  } while (bVar37);
                  bVar37 = true;
                }
LAB_001067ac:
                if (pbVar12[3] != 0x6e) {
                  bVar38 = bVar37;
                }
                if (bVar38) {
                  local_3fb4 = (int)lVar35;
                }
                uVar32 = (uint)bVar38;
              }
              else {
                uVar32 = uVar32 + 1;
              }
              for (; (*pbVar10 != 0 && (*pbVar10 != 10)); pbVar10 = pbVar10 + 1) {
                *pbVar10 = 0x20;
              }
            }
          }
        }
        pbVar29 = pbVar29 + 1;
        pbVar28 = pbVar28 + 1;
        uVar34 = uVar34 + 1;
      }
      if (uVar32 != 0) {
        Parse_cold_1();
        if (x2a == (s_x2 *)0x0) {
          return;
        }
        return;
      }
      uVar32 = 1;
      pbVar28 = filebuf;
LAB_00106821:
      while( true ) {
        while( true ) {
          bVar24 = *pbVar28;
          uVar6 = (ulong)bVar24;
          if (uVar6 == 10) {
            uVar32 = uVar32 + 1;
          }
          else if (bVar24 == 0) {
            free(filebuf);
            gp->rule = (rule *)CONCAT44(uStack_3c,uStack_40);
            gp->errorcnt = local_3f34;
            return;
          }
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + uVar6 * 2 + 1) & 0x20) == 0) break;
          pbVar28 = pbVar28 + 1;
        }
        if (bVar24 != 0x2f) break;
        if (pbVar28[1] == 0x2a) {
          bVar24 = pbVar28[2];
          bVar38 = bVar24 != 0;
          if (bVar24 == 0) {
            pbVar28 = pbVar28 + 2;
          }
          else {
            pbVar28 = pbVar28 + 3;
            do {
              if (bVar24 == 10) {
                uVar32 = uVar32 + 1;
              }
              else if ((bVar24 == 0x2f) && (pbVar28[-2] == 0x2a)) break;
              bVar24 = *pbVar28;
              pbVar28 = pbVar28 + 1;
              bVar38 = bVar24 != 0;
            } while (bVar38);
            pbVar28 = pbVar28 + -1;
          }
          pbVar28 = pbVar28 + bVar38;
        }
        else {
          if (pbVar28[1] != 0x2f) break;
          for (pbVar28 = pbVar28 + 2; (*pbVar28 != 0 && (*pbVar28 != 10)); pbVar28 = pbVar28 + 1) {
          }
        }
      }
      uVar31 = uVar32;
      local_3f38 = uVar32;
      local_3f30 = pbVar28;
      if (bVar24 == 0x7b) {
        pbVar29 = pbVar28 + 1;
        bVar24 = pbVar28[1];
        if (bVar24 != 0) {
          iVar4 = 1;
          do {
            if ((iVar4 < 2) && (bVar24 == 0x7d)) {
              pbVar28 = pbVar28 + 2;
              goto LAB_00106ade;
            }
            if (bVar24 < 0x2f) {
              if (bVar24 == 10) {
LAB_001069bf:
                uVar31 = uVar31 + 1;
              }
              else if ((bVar24 == 0x22) || (bVar24 == 0x27)) {
                bVar25 = pbVar29[1];
                pbVar29 = pbVar29 + 1;
                if (bVar25 != 0) {
                  bVar30 = 0;
                  do {
                    if ((bVar30 != 0x5c) && (bVar25 == bVar24)) break;
                    uVar31 = uVar31 + (bVar25 == 10);
                    bVar38 = bVar30 == 0x5c;
                    bVar30 = bVar25;
                    if (bVar38) {
                      bVar30 = 0;
                    }
                    bVar25 = pbVar29[1];
                    pbVar29 = pbVar29 + 1;
                  } while (bVar25 != 0);
                }
              }
            }
            else if (bVar24 == 0x2f) {
              if (pbVar28[2] == 0x2f) {
                for (pbVar29 = pbVar28 + 3; *pbVar29 != 0; pbVar29 = pbVar29 + 1) {
                  if (*pbVar29 == 10) goto LAB_001069bf;
                }
              }
              else if (pbVar28[2] == 0x2a) {
                pbVar29 = pbVar28 + 3;
                if (pbVar28[3] != 0) {
                  bVar24 = 0;
                  bVar25 = pbVar28[3];
                  do {
                    if (bVar24 == 0x2a && bVar25 == 0x2f) break;
                    uVar31 = uVar31 + (bVar25 == 10);
                    pbVar28 = pbVar29 + 1;
                    pbVar29 = pbVar29 + 1;
                    bVar24 = bVar25;
                    bVar25 = *pbVar28;
                  } while (*pbVar28 != 0);
                }
              }
            }
            else if (bVar24 == 0x7b) {
              iVar4 = iVar4 + 1;
            }
            else if (bVar24 == 0x7d) {
              iVar4 = iVar4 + -1;
            }
            pbVar28 = pbVar29;
            pbVar29 = pbVar28 + 1;
            bVar24 = pbVar28[1];
          } while (bVar24 != 0);
        }
        ErrorMsg(local_3f40,uVar32,
                 "C code starting on this line is not terminated before the end of the file.");
        local_3f34 = local_3f34 + 1;
        pbVar28 = pbVar29;
      }
      else {
        pbVar29 = pbVar28;
        if (bVar24 == 0x22) {
          do {
            pbVar28 = pbVar29 + 1;
            while( true ) {
              pbVar29 = pbVar28;
              bVar24 = *pbVar29;
              if (bVar24 == 10) break;
              pbVar28 = pbVar29 + 1;
              if (bVar24 == 0x22) goto LAB_00106ade;
              if (bVar24 == 0) {
                Parse_cold_2();
                pbVar28 = pbVar29;
                goto LAB_00106ade;
              }
            }
            uVar31 = uVar31 + 1;
          } while( true );
        }
        puVar2 = *ppuVar11;
        if ((puVar2[uVar6] & 8) == 0) {
          if ((uVar6 == 0x2f) || (bVar24 == 0x7c)) {
LAB_00106acd:
            if ((*(byte *)((long)puVar2 + (ulong)pbVar28[1] * 2 + 1) & 4) != 0) {
              bVar24 = pbVar28[2];
              pbVar29 = pbVar28 + 2;
              while ((pbVar28 = pbVar29, bVar24 != 0 &&
                     ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
                bVar24 = pbVar29[1];
                pbVar29 = pbVar29 + 1;
              }
              goto LAB_00106ade;
            }
          }
          else if (bVar24 == 0x3a) {
            if ((pbVar28[1] == 0x3a) && (pbVar28[2] == 0x3d)) {
              pbVar29 = pbVar28 + 3;
              pbVar28 = pbVar29;
              goto LAB_00106ade;
            }
            if (uVar6 == 0x7c) goto LAB_00106acd;
          }
          pbVar29 = pbVar28 + 1;
          pbVar28 = pbVar29;
        }
        else {
          bVar24 = *pbVar28;
          while ((pbVar28 = pbVar29, bVar24 != 0 &&
                 ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
            bVar24 = pbVar29[1];
            pbVar29 = pbVar29 + 1;
          }
        }
      }
LAB_00106ade:
      uVar32 = uVar31;
      bVar24 = *pbVar29;
      *pbVar29 = 0;
      pbVar12 = (byte *)Strsafe((char *)local_3f30);
      uVar31 = local_3ef8;
      psVar14 = local_3f10;
      psVar16 = local_3f18;
      switch(local_3f20) {
      case 0:
        local_70 = (rule *)0x0;
        uStack_34 = 0;
        local_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        uStack_38 = 0;
        local_3f28->nrule = 0;
      case 1:
        uVar6 = (ulong)*pbVar12;
        if (uVar6 == 0x25) {
LAB_00106fee:
          local_3f20 = 2;
        }
        else if ((*(byte *)((long)*ppuVar11 + uVar6 * 2 + 1) & 2) == 0) {
          if (uVar6 == 0x5b) {
            local_3f20 = 0xc;
          }
          else if (*pbVar12 == 0x7b) {
            if (local_70 == (rule *)0x0) {
              Parse_cold_8();
              psVar16 = local_3f18;
            }
            else if (local_70->code == (char *)0x0) {
              local_70->line = local_3f38;
              local_70->code = (char *)(pbVar12 + 1);
              local_70->noCode = 0;
            }
            else {
              Parse_cold_7();
              psVar16 = local_3f18;
            }
          }
          else {
            pcVar26 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107bb0:
            ErrorMsg(local_3f40,local_3f38,pcVar26,pbVar12);
            local_3f34 = local_3f34 + 1;
            psVar16 = local_3f18;
          }
        }
        else {
          local_3f08 = Symbol_new((char *)pbVar12);
          local_3ef8 = 0;
          local_3f00 = (byte *)0x0;
          local_3f20 = 5;
          psVar16 = local_3f18;
        }
        break;
      case 2:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 4) == 0) {
          pcVar26 = "Illegal declaration keyword: \"%s\".";
          goto LAB_00107b28;
        }
        local_60 = (char **)0x0;
        local_50 = (int *)0x0;
        local_58 = 1;
        local_3f20 = 3;
        local_68 = pbVar12;
        iVar4 = strcmp((char *)pbVar12,"name");
        if (iVar4 == 0) {
          local_60 = &local_3f28->name;
          goto LAB_001075e2;
        }
        iVar4 = strcmp((char *)pbVar12,"include");
        if (iVar4 == 0) {
          local_60 = &local_3f28->include;
          psVar16 = local_3f18;
        }
        else {
          iVar4 = strcmp((char *)pbVar12,"code");
          if (iVar4 == 0) {
            lVar8 = 0xa8;
          }
          else {
            iVar4 = strcmp((char *)pbVar12,"token_destructor");
            if (iVar4 == 0) {
              lVar8 = 0xb0;
            }
            else {
              iVar4 = strcmp((char *)pbVar12,"default_destructor");
              if (iVar4 == 0) {
                lVar8 = 0xb8;
              }
              else {
                iVar4 = strcmp((char *)pbVar12,"token_prefix");
                if (iVar4 == 0) {
                  local_60 = &local_3f28->tokenprefix;
LAB_001075e2:
                  local_58 = 0;
                  psVar16 = local_3f18;
                  break;
                }
                iVar4 = strcmp((char *)pbVar12,"syntax_error");
                if (iVar4 == 0) {
                  lVar8 = 0x88;
                }
                else {
                  iVar4 = strcmp((char *)pbVar12,"parse_accept");
                  if (iVar4 == 0) {
                    lVar8 = 0xa0;
                  }
                  else {
                    iVar4 = strcmp((char *)pbVar12,"parse_failure");
                    if (iVar4 == 0) {
                      lVar8 = 0x98;
                    }
                    else {
                      iVar4 = strcmp((char *)pbVar12,"stack_overflow");
                      if (iVar4 != 0) {
                        iVar4 = strcmp((char *)pbVar12,"extra_argument");
                        if (iVar4 == 0) {
                          local_60 = &local_3f28->arg;
                        }
                        else {
                          iVar4 = strcmp((char *)pbVar12,"token_type");
                          if (iVar4 == 0) {
                            local_60 = &local_3f28->tokentype;
                          }
                          else {
                            iVar4 = strcmp((char *)pbVar12,"default_type");
                            if (iVar4 == 0) {
                              local_60 = &local_3f28->vartype;
                            }
                            else {
                              iVar4 = strcmp((char *)pbVar12,"stack_size");
                              if (iVar4 == 0) {
                                local_60 = &local_3f28->stacksize;
                              }
                              else {
                                iVar4 = strcmp((char *)pbVar12,"start_symbol");
                                if (iVar4 != 0) {
                                  iVar4 = strcmp((char *)pbVar12,"left");
                                  if (iVar4 == 0) {
                                    local_44 = local_44 + 1;
                                    local_48 = LEFT;
                                  }
                                  else {
                                    iVar4 = strcmp((char *)pbVar12,"right");
                                    if (iVar4 == 0) {
                                      local_44 = local_44 + 1;
                                      local_48 = RIGHT;
                                    }
                                    else {
                                      iVar4 = strcmp((char *)pbVar12,"nonassoc");
                                      if (iVar4 != 0) {
                                        iVar4 = strcmp((char *)pbVar12,"destructor");
                                        if (iVar4 == 0) {
                                          local_3f20 = 0x10;
                                          psVar16 = local_3f18;
                                        }
                                        else {
                                          iVar4 = strcmp((char *)pbVar12,"type");
                                          if (iVar4 == 0) {
                                            local_3f20 = 0x11;
                                            psVar16 = local_3f18;
                                          }
                                          else {
                                            iVar4 = strcmp((char *)pbVar12,"fallback");
                                            if (iVar4 == 0) {
                                              local_3f18 = (symbol *)0x0;
                                              local_3f20 = 0x12;
                                              psVar16 = local_3f18;
                                            }
                                            else {
                                              iVar4 = strcmp((char *)pbVar12,"wildcard");
                                              if (iVar4 == 0) {
                                                local_3f20 = 0x13;
                                                psVar16 = local_3f18;
                                              }
                                              else {
                                                iVar4 = strcmp((char *)pbVar12,"token_class");
                                                if (iVar4 != 0) {
                                                  pcVar26 = "Unknown declaration keyword: \"%%%s\"."
                                                  ;
                                                  goto LAB_00107b28;
                                                }
                                                local_3f20 = 0x14;
                                                psVar16 = local_3f18;
                                              }
                                            }
                                          }
                                        }
                                        break;
                                      }
                                      local_44 = local_44 + 1;
                                      local_48 = NONE;
                                    }
                                  }
                                  local_3f20 = 4;
                                  psVar16 = local_3f18;
                                  break;
                                }
                                local_60 = &local_3f28->start;
                              }
                            }
                          }
                        }
                        goto LAB_001075e2;
                      }
                      lVar8 = 0x90;
                    }
                  }
                }
              }
            }
          }
          local_60 = (char **)((long)&local_3f28->sorted + lVar8);
          psVar16 = local_3f18;
        }
        break;
      case 3:
        bVar25 = *pbVar12;
        if (((bVar25 != 0x22) && (bVar25 != 0x7b)) && (((*ppuVar11)[bVar25] & 8) == 0)) {
          ErrorMsg(local_3f40,local_3f38,"Illegal argument to %%%s: %s",local_68,pbVar12);
          goto LAB_00107b2f;
        }
        if (((ulong)bVar25 == 0x7b) || (bVar25 == 0x22)) {
          pbVar12 = pbVar12 + 1;
        }
        sVar7 = strlen((char *)pbVar12);
        pcVar26 = *local_60;
        if (pcVar26 == (char *)0x0) {
          pcVar26 = "";
        }
        sVar33 = strlen(pcVar26);
        bVar38 = false;
        if ((local_3f28->nolinenosflag == 0) && (local_58 != 0)) {
          if (local_50 == (int *)0x0) {
            bVar38 = true;
          }
          else {
            bVar38 = *local_50 != 0;
          }
        }
        iVar4 = (int)sVar33;
        iVar5 = (int)sVar7;
        iVar21 = iVar4 + iVar5 + 0x14;
        if (bVar38) {
          iVar27 = 0;
          pcVar26 = local_3f40;
          do {
            if (*pcVar26 == '\\') {
              iVar27 = iVar27 + 1;
            }
            else if (*pcVar26 == '\0') goto LAB_001076da;
            pcVar26 = pcVar26 + 1;
          } while( true );
        }
        sVar7 = 0;
        goto LAB_00107720;
      case 4:
        if ((ulong)*pbVar12 == 0x2e) goto LAB_001073d7;
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 1) == 0) {
          pcVar26 = "Can\'t assign a precedence to \"%s\".";
        }
        else {
          psVar14 = Symbol_new((char *)pbVar12);
          if (psVar14->prec < 0) {
            psVar14->prec = local_44;
            psVar14->assoc = local_48;
            psVar16 = local_3f18;
            break;
          }
          pcVar26 = "Symbol \"%s\" has already be given a precedence.";
        }
        goto LAB_00107bb0;
      case 5:
        if (*pbVar12 == 0x28) {
          local_3f20 = 7;
        }
        else {
          if (((*pbVar12 == 0x3a) && (pbVar12[1] == 0x3a)) && (pbVar12[2] == 0x3d))
          goto LAB_00106c7b;
          pbVar12 = (byte *)local_3f08->name;
          pcVar26 = "Expected to see a \":\" following the LHS symbol \"%s\".";
LAB_00107c19:
          ErrorMsg(local_3f40,local_3f38,pcVar26,pbVar12);
LAB_00107c20:
          local_3f34 = local_3f34 + 1;
          local_3f20 = 0xe;
          psVar16 = local_3f18;
        }
        break;
      case 6:
        bVar25 = *pbVar12;
        uVar6 = (ulong)bVar25;
        if (uVar6 != 0x2e) {
          if ((*(byte *)((long)*ppuVar11 + uVar6 * 2 + 1) & 4) == 0) {
            if (uVar6 == 0x28) {
LAB_00107892:
              if (0 < (int)local_3ef8) {
                local_3f20 = 10;
                break;
              }
            }
            else if ((bVar25 == 0x7c) || (bVar25 == 0x2f)) {
              lVar8 = (long)(int)local_3ef8;
              if (0 < lVar8) {
                puVar23 = (undefined8 *)alStack_3ef0[local_3ef8 - 1];
                puVar17 = puVar23;
                if (*(int *)((long)puVar23 + 0xc) != 2) {
                  puVar17 = (undefined8 *)calloc(1,0x60);
                  *(undefined4 *)((long)puVar17 + 0xc) = 2;
                  *(undefined4 *)((long)puVar17 + 0x54) = 1;
                  plVar18 = (long *)calloc(1,8);
                  puVar17[0xb] = plVar18;
                  *plVar18 = (long)puVar23;
                  *puVar17 = *puVar23;
                  alStack_3ef0[lVar8 + -1] = (long)puVar17;
                }
                iVar4 = *(int *)((long)puVar17 + 0x54);
                *(int *)((long)puVar17 + 0x54) = iVar4 + 1;
                pvVar19 = realloc((void *)puVar17[0xb],(long)iVar4 * 8 + 8);
                puVar17[0xb] = pvVar19;
                psVar14 = Symbol_new((char *)(pbVar12 + 1));
                *(symbol **)(puVar17[0xb] + -8 + (long)*(int *)((long)puVar17 + 0x54) * 8) = psVar14
                ;
                if (((*(byte *)((long)*ppuVar11 + (ulong)pbVar12[1] * 2 + 1) & 2) != 0) ||
                   (psVar16 = local_3f18,
                   (*(byte *)((long)*ppuVar11 +
                             (ulong)*(byte *)**(undefined8 **)puVar17[0xb] * 2 + 1) & 2) != 0)) {
                  Parse_cold_3();
                  psVar16 = local_3f18;
                }
                break;
              }
              if (bVar25 == 0x28) goto LAB_00107892;
            }
            pcVar26 = "Illegal character on RHS of rule: \"%s\".";
            goto LAB_00107c19;
          }
          if (999 < (int)local_3ef8) {
            pcVar26 = "Too many symbols on RHS of rule beginning at \"%s\".";
            goto LAB_00107c19;
          }
          psVar14 = Symbol_new((char *)pbVar12);
          alStack_3ef0[(int)local_3ef8] = (long)psVar14;
          auStack_1fb8[(long)(int)local_3ef8 + 1] = 0;
          local_3ef8 = local_3ef8 + 1;
          psVar16 = local_3f18;
          break;
        }
        uVar6 = (ulong)local_3ef8;
        lVar8 = (long)(int)local_3ef8;
        prVar13 = (rule *)calloc(lVar8 * 0x10 + 0x80,1);
        if (prVar13 == (rule *)0x0) {
          ErrorMsg(local_3f40,local_3f38,"Can\'t allocate enough memory for this rule.");
          local_3f34 = local_3f34 + 1;
          local_70 = (rule *)0x0;
        }
        else {
          prVar13->ruleline = local_3f38;
          prVar13->rhs = &prVar13[1].lhs;
          prVar13->rhsalias = (char **)(&prVar13[1].lhs + lVar8);
          if (0 < (int)uVar31) {
            uVar34 = 0;
            do {
              prVar13->rhs[uVar34] = (symbol *)alStack_3ef0[uVar34];
              prVar13->rhsalias[uVar34] = (char *)auStack_1fb8[uVar34 + 1];
              uVar34 = uVar34 + 1;
            } while (uVar6 != uVar34);
          }
          prVar13->lhs = local_3f08;
          prVar13->lhsalias = (char *)local_3f00;
          prVar13->nrhs = uVar31;
          prVar13->code = (char *)0x0;
          prVar13->noCode = 1;
          prVar13->precsym = (symbol *)0x0;
          iVar4 = local_3f28->nrule;
          local_3f28->nrule = iVar4 + 1;
          prVar13->index = iVar4;
          prVar13->nextlhs = local_3f08->rule;
          local_3f08->rule = prVar13;
          prVar13->next = (rule *)0x0;
          bVar38 = CONCAT44(uStack_3c,uStack_40) != 0;
          puVar23 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x78);
          if (!bVar38) {
            puVar23 = (undefined8 *)&uStack_38;
          }
          *puVar23 = prVar13;
          *(rule **)(&uStack_40 + (ulong)bVar38 * 2) = prVar13;
          local_70 = prVar13;
        }
        goto LAB_001077f4;
      case 7:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 4) == 0) {
          pbVar10 = (byte *)local_3f08->name;
          pcVar26 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
LAB_00107991:
          ErrorMsg(local_3f40,local_3f38,pcVar26,pbVar12,pbVar10);
          goto LAB_00107c20;
        }
        local_3f20 = 8;
        local_3f00 = pbVar12;
        break;
      case 8:
        if (*pbVar12 != 0x29) {
LAB_00107854:
          pcVar26 = "Missing \")\" following LHS alias name \"%s\".";
          pbVar12 = local_3f00;
          goto LAB_00107c19;
        }
        local_3f20 = 9;
        break;
      case 9:
        if (((*pbVar12 != 0x3a) || (pbVar12[1] != 0x3a)) || (pbVar12[2] != 0x3d)) {
          pbVar12 = (byte *)local_3f08->name;
          pcVar26 = "Missing \"->\" following: \"%s(%s)\".";
          pbVar10 = local_3f00;
          goto LAB_00107991;
        }
        goto LAB_00106c7b;
      case 10:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 4) == 0) {
          pbVar10 = *(byte **)alStack_3ef0[(long)(int)local_3ef8 + -1];
          pcVar26 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
          goto LAB_00107991;
        }
        auStack_1fb8[(int)local_3ef8] = pbVar12;
        local_3f20 = 0xb;
        break;
      case 0xb:
        if (*pbVar12 != 0x29) goto LAB_00107854;
LAB_00106c7b:
        local_3f20 = 6;
        break;
      case 0xc:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 1) == 0) {
          Parse_cold_6();
        }
        else if (local_70 == (rule *)0x0) {
          ErrorMsg(local_3f40,local_3f38,"There is no prior rule to assign precedence \"[%s]\".",
                   pbVar12);
          local_3f34 = local_3f34 + 1;
        }
        else if (local_70->precsym == (symbol *)0x0) {
          psVar14 = Symbol_new((char *)pbVar12);
          local_70->precsym = psVar14;
        }
        else {
          Parse_cold_5();
        }
        local_3f20 = 0xd;
        psVar16 = local_3f18;
        break;
      case 0xd:
        if (*pbVar12 != 0x5d) {
          Parse_cold_4();
        }
        goto LAB_001073d7;
      case 0xe:
      case 0xf:
        if (*pbVar12 == 0x2e) {
          local_3f20 = 1;
        }
        if (*pbVar12 != 0x25) break;
        goto LAB_00106fee;
      case 0x10:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 4) == 0) {
          pcVar26 = "Symbol name missing after %%destructor keyword";
LAB_0010793e:
          ErrorMsg(local_3f40,local_3f38,pcVar26);
          goto LAB_00107b2f;
        }
        psVar14 = Symbol_new((char *)pbVar12);
        local_60 = &psVar14->destructor;
        local_50 = &psVar14->destLineno;
        local_58 = 1;
        local_3f20 = 3;
        psVar16 = local_3f18;
        break;
      case 0x11:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 4) == 0) {
          pcVar26 = "Symbol name missing after %%type keyword";
          goto LAB_0010793e;
        }
        psVar14 = Symbol_find((char *)pbVar12);
        if (psVar14 == (symbol *)0x0) {
          psVar14 = Symbol_new((char *)pbVar12);
        }
        else if (psVar14->datatype != (char *)0x0) {
          ErrorMsg(local_3f40,local_3f38,"Symbol %%type \"%s\" already defined",pbVar12);
          local_3f34 = local_3f34 + 1;
          local_3f20 = 0xf;
          psVar16 = local_3f18;
          break;
        }
        local_60 = &psVar14->datatype;
        local_58 = 0;
        local_3f20 = 3;
        psVar16 = local_3f18;
        break;
      case 0x12:
        if ((ulong)*pbVar12 == 0x2e) goto LAB_001073d7;
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 1) == 0) {
          pcVar26 = "%%fallback argument \"%s\" should be a token";
          goto LAB_00107bb0;
        }
        psVar16 = Symbol_new((char *)pbVar12);
        if (local_3f18 != (symbol *)0x0) {
          if (psVar16->fallback != (symbol *)0x0) {
            pcVar26 = "More than one fallback assigned to token %s";
            goto LAB_00107bb0;
          }
          psVar16->fallback = local_3f18;
          local_3f28->has_fallback = 1;
          psVar16 = local_3f18;
        }
        break;
      case 0x13:
        if ((ulong)*pbVar12 != 0x2e) {
          if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 1) == 0) {
            pcVar26 = "%%wildcard argument \"%s\" should be a token";
          }
          else {
            psVar14 = Symbol_new((char *)pbVar12);
            if (local_3f28->wildcard == (symbol *)0x0) {
              local_3f28->wildcard = psVar14;
              psVar16 = local_3f18;
              break;
            }
            pcVar26 = "Extra wildcard to token: %s";
          }
          goto LAB_00107bb0;
        }
LAB_001073d7:
        local_3f20 = 1;
        psVar16 = local_3f18;
        break;
      case 0x14:
        if ((*(byte *)((long)*ppuVar11 + (ulong)*pbVar12 * 2 + 1) & 2) == 0) {
          pcVar26 = "%%token_class must be followed by an identifier: ";
        }
        else {
          psVar14 = Symbol_find((char *)pbVar12);
          if (psVar14 == (symbol *)0x0) {
            local_3f10 = Symbol_new((char *)pbVar12);
            local_3f10->type = MULTITERMINAL;
            local_3f20 = 0x15;
            psVar16 = local_3f18;
            break;
          }
          pcVar26 = "Symbol \"%s\" already used";
        }
LAB_00107b28:
        ErrorMsg(local_3f40,local_3f38,pcVar26,pbVar12);
LAB_00107b2f:
        local_3f34 = local_3f34 + 1;
        local_3f20 = 0xf;
        psVar16 = local_3f18;
        break;
      case 0x15:
        uVar6 = (ulong)*pbVar12;
        if (uVar6 == 0x2e) goto LAB_001073d7;
        if (((*(byte *)((long)*ppuVar11 + uVar6 * 2 + 1) & 1) == 0) &&
           (((uVar6 != 0x7c && (*pbVar12 != 0x2f)) ||
            ((*(byte *)((long)*ppuVar11 + (ulong)pbVar12[1] * 2 + 1) & 1) == 0)))) {
          pcVar26 = "%%token_class argument \"%s\" should be a token";
          goto LAB_00107b28;
        }
        iVar4 = local_3f10->nsubsym;
        local_3f10->nsubsym = iVar4 + 1;
        ppsVar15 = (symbol **)realloc(local_3f10->subsym,(long)iVar4 * 8 + 8);
        psVar14->subsym = ppsVar15;
        psVar16 = Symbol_new((char *)(pbVar12 + (((*ppuVar11)[*pbVar12] >> 8 & 1) == 0)));
        psVar14->subsym[(long)psVar14->nsubsym + -1] = psVar16;
        psVar16 = local_3f18;
      }
      goto switchD_00106b14_default;
    }
    Parse_cold_9();
  }
  return;
LAB_001076da:
  sprintf(local_3f78,"#line %d ",(ulong)local_3f38);
  sVar7 = strlen(local_3f78);
  sVar33 = strlen(local_3f40);
  iVar21 = iVar27 + iVar21 + (int)sVar7 + (int)sVar33;
  sVar7 = (size_t)(int)sVar7;
LAB_00107720:
  pcVar26 = (char *)realloc(*local_60,(long)iVar21);
  *local_60 = pcVar26;
  pcVar26 = *local_60 + iVar4;
  if (bVar38) {
    if ((iVar4 != 0) && (pcVar26[-1] != '\n')) {
      *pcVar26 = '\n';
      pcVar26 = pcVar26 + 1;
    }
    memcpy(pcVar26,local_3f78,sVar7);
    pcVar20 = pcVar26 + sVar7;
    pcVar26[sVar7] = '\"';
    pcVar26 = local_3f40;
    do {
      if (*pcVar26 == '\\') {
        pcVar20[1] = '\\';
        pcVar20 = pcVar20 + 2;
      }
      else {
        if (*pcVar26 == '\0') goto LAB_001077af;
        pcVar20 = pcVar20 + 1;
      }
      *pcVar20 = *pcVar26;
      pcVar26 = pcVar26 + 1;
    } while( true );
  }
LAB_001077bc:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f38;
  }
  memcpy(pcVar26,pbVar12,(long)iVar5);
  pcVar26[iVar5] = '\0';
LAB_001077f4:
  local_3f20 = 1;
  psVar16 = local_3f18;
switchD_00106b14_default:
  local_3f18 = psVar16;
  *pbVar29 = bVar24;
  goto LAB_00106821;
LAB_001077af:
  pcVar20[1] = '\"';
  pcVar20[2] = '\n';
  pcVar26 = pcVar20 + 3;
  goto LAB_001077bc;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filesize>100000000 || filebuf==0 ){
    ErrorMsg(ps.filename,0,"Input file too large.");
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  fclose(fp);
  filesize = strip_crlf(filebuf, filesize);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( ISSPACE(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( ISALNUM(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && ISALPHA(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}